

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O2

int root_write(int hdl,void *buffer,long nbytes)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int opt;
  int iVar4;
  int buflen;
  int op;
  int astat;
  char msg [100];
  
  iVar2 = handleTable[hdl].sock;
  snprintf(msg,100,"%ld %ld ",handleTable[hdl].currentpos,nbytes);
  sVar3 = strlen(msg);
  buflen = (int)sVar3 + 1;
  opt = buflen;
  iVar1 = root_send_buffer(iVar2,0x7d5,msg,buflen);
  iVar4 = 0x6a;
  if (iVar1 == buflen) {
    iVar2 = NET_SendRaw(iVar2,buffer,(int)nbytes,opt);
    if (iVar2 == nbytes) {
      astat = 0;
      root_recv_buffer(handleTable[hdl].sock,&op,(char *)&astat,opt);
      if (astat == 0) {
        handleTable[hdl].currentpos = handleTable[hdl].currentpos + nbytes;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int root_write(int hdl, void *buffer, long nbytes)
/*
  write bytes at the current position in the file
*/
{

  char msg[SHORTLEN];
  int len;
  int sock;
  int status;
  int astat;
  int op;

  sock = handleTable[hdl].sock;
  /* we presume here that the file position will never be > 2**31 = 2.1GB */
  snprintf(msg,SHORTLEN,"%ld %ld ",(long) handleTable[hdl].currentpos,nbytes);

  len = strlen(msg);
  status = root_send_buffer(sock,ROOTD_PUT,msg,len+1);
  if (status != len+1) {
    return (WRITE_ERROR);
  }
  status = NET_SendRaw(sock,buffer,nbytes,NET_DEFAULT);
  if (status != nbytes) {
    return (WRITE_ERROR);
  }
  astat = 0;
  status = root_recv_buffer(handleTable[hdl].sock,&op,(char *) &astat,4);

  if (astat != 0) {
    return (WRITE_ERROR);
  }
  handleTable[hdl].currentpos += nbytes;
  return(0);
}